

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

TSPoint TSEndPointOfText(u16string *text)

{
  TSPoint TVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  uint local_28;
  int iStack_24;
  value_type c;
  uint32_t i;
  uint32_t lastNewlineIndex;
  uint32_t length;
  uint32_t newlines;
  u16string *text_local;
  
  bVar2 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::empty(text)
  ;
  if (bVar2) {
    text_local._0_4_ = 0;
    text_local._4_4_ = 0;
  }
  else {
    lastNewlineIndex = 0;
    sVar4 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::length
                      (text);
    uVar3 = (uint)sVar4;
    iStack_24 = 0;
    for (local_28 = 0; local_28 < uVar3; local_28 = local_28 + 1) {
      pvVar5 = std::__cxx11::
               basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
               operator[](text,(ulong)local_28);
      if (*pvVar5 == L'\n') {
        lastNewlineIndex = lastNewlineIndex + 1;
        iStack_24 = local_28 + 1;
      }
      else if (*pvVar5 == L'\r') {
        lastNewlineIndex = lastNewlineIndex + 1;
        iStack_24 = local_28 + 1;
        if ((local_28 + 1 < uVar3) &&
           (pvVar5 = std::__cxx11::
                     basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                     operator[](text,(ulong)(local_28 + 1)), *pvVar5 == L'\n')) {
          iStack_24 = local_28 + 2;
          local_28 = local_28 + 1;
        }
      }
    }
    text_local._0_4_ = lastNewlineIndex;
    text_local._4_4_ = (uVar3 - iStack_24) * 2;
  }
  TVar1.column = text_local._4_4_;
  TVar1.row = (uint32_t)text_local;
  return TVar1;
}

Assistant:

TSPoint TSEndPointOfText (u16string &text) {
    if (text.empty()) return TSPoint { 0, 0 };

    uint32_t newlines = 0;
    auto length = static_cast<uint32_t>(text.length());

    uint32_t lastNewlineIndex = 0;

    for (uint32_t i = 0; i < length; i++) {
        auto c = text[i];

        switch (c) {
            case '\r':
                newlines++;
                lastNewlineIndex = i + 1;
                if (i + 1 < length && text[i + 1] == '\n') { i++; lastNewlineIndex++; }
                break;
            case '\n':
                newlines++;
                lastNewlineIndex = i + 1;
                break;
            default: {}
        }
    }

    return TSPoint { newlines, (length - lastNewlineIndex) << 1 };
}